

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<capnproto_test::capnp::test::TestCallOrder::Client> * __thiscall
kj::_::NullableValue<capnproto_test::capnp::test::TestCallOrder::Client>::operator=
          (NullableValue<capnproto_test::capnp::test::TestCallOrder::Client> *this,
          NullableValue<capnproto_test::capnp::test::TestCallOrder::Client> *other)

{
  Client *params;
  NullableValue<capnproto_test::capnp::test::TestCallOrder::Client> *other_local;
  NullableValue<capnproto_test::capnp::test::TestCallOrder::Client> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<capnproto_test::capnp::test::TestCallOrder::Client>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<capnproto_test::capnp::test::TestCallOrder::Client>(&(other->field_1).value);
      ctor<capnproto_test::capnp::test::TestCallOrder::Client,capnproto_test::capnp::test::TestCallOrder::Client>
                (&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }